

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O2

Vec_Int_t * Sim_UtilCountOnesArray(Vec_Ptr_t *vInfo,int nSimWords)

{
  int iVar1;
  Vec_Int_t *p;
  int *__s;
  uint *pSimInfo;
  int iVar2;
  
  iVar1 = vInfo->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar2 = iVar1;
  }
  p->nCap = iVar2;
  if (iVar2 == 0) {
    p->pArray = (int *)0x0;
    p->nSize = iVar1;
  }
  else {
    __s = (int *)malloc((long)iVar2 << 2);
    p->pArray = __s;
    p->nSize = iVar1;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)iVar1 << 2);
    }
  }
  for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
    pSimInfo = (uint *)Vec_PtrEntry(vInfo,iVar2);
    iVar1 = Sim_UtilCountOnes(pSimInfo,nSimWords);
    Vec_IntWriteEntry(p,iVar2,iVar1);
    iVar1 = vInfo->nSize;
  }
  return p;
}

Assistant:

Vec_Int_t * Sim_UtilCountOnesArray( Vec_Ptr_t * vInfo, int nSimWords )
{
    Vec_Int_t * vCounters;
    unsigned * pSimInfo;
    int i;
    vCounters = Vec_IntStart( Vec_PtrSize(vInfo) );
    Vec_PtrForEachEntry( unsigned *, vInfo, pSimInfo, i )
        Vec_IntWriteEntry( vCounters, i, Sim_UtilCountOnes(pSimInfo, nSimWords) );
    return vCounters;
}